

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_sse2.c
# Opt level: O0

void apply_temporal_filter
               (uint8_t *frame1,uint stride,uint8_t *frame2,uint stride2,int block_width,
               int block_height,int *subblock_mses,uint *accumulator,uint16_t *count,
               uint16_t *frame_sse,uint32_t *luma_sse_sum,double inv_num_ref_pixels,
               double decay_factor,double inv_factor,double weight_factor,double *d_factor,
               int tf_wgt_calc_lvl)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  __m256 y;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  int iVar39;
  uint in_ECX;
  int iVar40;
  long lVar41;
  long lVar42;
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  int in_R9D;
  int iVar43;
  double in_XMM0_Qa;
  double dVar44;
  int iVar58;
  int iVar59;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  undefined1 auVar57 [32];
  int iVar64;
  double in_XMM1_Qa;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  double in_XMM2_Qa;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  double in_XMM3_Qa;
  long in_stack_00000008;
  __m256i pred_values_u32;
  __m128i pred_values;
  __m256i accumulator_array;
  __m128i count_array;
  int stride_idx;
  __m128i weights_in_16bit;
  __m256i weights_in_32bit;
  __m256 round_result;
  __m256 scale_weight_exp_result;
  __m256 exp_result;
  __m256 minus_scaled_diff_ps;
  __m256 scaled_diff_ps;
  __m256 scaled_error_ps;
  __m128 scaled_error_ps_2;
  __m128 scaled_error_ps_1;
  __m256d scaled_error_2;
  __m256d scaled_error_1;
  __m256d d_fact_mul_n_decay;
  __m256d combined_error_2;
  __m256d combined_error_1;
  __m256d blk_error;
  int subblock_idx_1;
  __m256d window_error_2;
  __m256d window_error_1;
  __m256d diff_sse_pd_2;
  __m256d diff_sse_pd_1;
  __m256i diff_sse_1;
  __m256i luma_sse;
  __m256i acc_sse;
  int j_1;
  uint32_t *luma_sse_sum_temp;
  int y_blk_raster_offset_1;
  int i_7;
  __m256 tf_weight_scale;
  __m256d weight_factor_256bit;
  __m256d inv_num_ref_pixel_256bit;
  __m256 seven;
  __m256 point_five;
  __m256 zero;
  __m256d d_factor_mul_n_decay_qr_invs [4];
  __m256d subblock_mses_reg [4];
  int weight;
  double scaled_error;
  double combined_error;
  int subblock_idx;
  double window_error;
  uint32_t diff_sse;
  int pixel_value;
  int j;
  int y_blk_raster_offset;
  int k;
  int i_6;
  int idx;
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  int i_5;
  int i_4;
  int i_3;
  __m256i vsum;
  int row;
  int i_2;
  uint16_t *src;
  int col;
  __m256i vsrc [5];
  uint32_t acc_5x5_sse [32] [32];
  __m128i vtmp2;
  __m128i vtmp1;
  __m256i vres2;
  __m256i vres1;
  __m256i vdiff2;
  __m256i vdiff1;
  __m256i vdiff;
  __m256i vmax;
  __m256i vmin;
  __m256i vsrc2;
  __m256i vsrc1;
  int i;
  uint16_t *dst;
  uint8_t *src2;
  uint8_t *src1;
  __m256i vsqdiff1;
  __m256i vdiff1_1;
  __m256i vf2;
  __m256i vf1;
  __m128i vf2_128;
  __m128i vf1_128;
  int i_1;
  uint16_t *dst_1;
  uint8_t *src2_1;
  uint8_t *src1_1;
  __m128i v128tmp_1;
  __m128i v128tmp;
  __m128i v128b;
  __m128i v128a;
  __m256i vtmp;
  double local_29d8;
  undefined1 (*in_stack_ffffffffffffd638) [16];
  undefined8 in_stack_ffffffffffffd640;
  undefined8 in_stack_ffffffffffffd648;
  undefined8 in_stack_ffffffffffffd650;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2910;
  undefined8 uStack_2908;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 local_2810;
  undefined8 uStack_2808;
  double local_26e0;
  double dStack_26d8;
  double dStack_26d0;
  double dStack_26c8;
  double local_26c0;
  double dStack_26b8;
  double dStack_26b0;
  double dStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  int local_2634;
  int local_2624;
  double local_2560 [33];
  int local_2454;
  double local_2450;
  double local_2448;
  int local_243c;
  double local_2438;
  uint local_242c;
  uint local_2428;
  int local_2424;
  int local_2420;
  int local_241c;
  int local_2418;
  int local_2414;
  double local_2410;
  ulong local_2408;
  ulong local_2400;
  ulong local_23f8;
  double local_23f0;
  ulong local_23e8;
  ulong local_23e0;
  ulong local_23d8;
  int local_23cc;
  int local_23c8;
  int local_23c4;
  undefined1 local_23c0 [32];
  int local_2398;
  int local_2394;
  undefined1 (*local_2390) [16];
  int local_2384;
  undefined8 local_2380 [12];
  undefined1 local_2320 [32];
  undefined1 local_2300 [32];
  int local_22d0 [1026];
  double local_12c8;
  double local_12b0;
  int local_12a4;
  int local_12a0;
  uint local_129c;
  undefined1 (*local_1298) [32];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 (*local_1248) [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [24];
  undefined8 uStack_1088;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  int local_fe4;
  uint16_t *local_fe0;
  undefined1 (*local_fd8) [32];
  undefined1 (*local_fd0) [32];
  undefined4 local_fc4;
  uint16_t *local_fc0;
  undefined1 (*local_f90) [32];
  undefined1 (*local_f88) [32];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined1 local_ee0 [16];
  undefined8 local_ed0;
  ulong uStack_ec8;
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  int local_e14;
  uint16_t *local_e10;
  undefined1 (*local_e08) [32];
  undefined1 (*local_e00) [32];
  undefined4 local_df4;
  uint16_t *local_df0;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [16];
  undefined8 local_d30;
  ulong uStack_d28;
  undefined1 local_d20 [16];
  int local_d0c;
  undefined1 (*local_d08) [16];
  undefined1 local_d00 [16];
  int local_cec;
  undefined1 (*local_ce8) [16];
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [24];
  undefined8 uStack_ca8;
  int local_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined4 local_bd0;
  undefined4 local_bcc;
  undefined4 local_bc8;
  undefined4 local_bc4;
  ulong local_bc0;
  ulong local_bb8;
  ulong local_bb0;
  double local_ba8;
  ulong local_ba0;
  ulong local_b98;
  ulong local_b90;
  double local_b88;
  undefined1 (*local_b70) [32];
  undefined1 (*local_b68) [32];
  undefined1 local_b60 [16];
  undefined8 local_b50;
  undefined8 uStack_b48;
  double local_b40;
  double dStack_b38;
  double dStack_b30;
  double dStack_b28;
  double local_b20;
  double dStack_b18;
  double dStack_b10;
  double dStack_b08;
  double local_b00;
  double dStack_af8;
  double dStack_af0;
  double dStack_ae8;
  double local_ae0;
  double dStack_ad8;
  double dStack_ad0;
  double dStack_ac8;
  double local_ac0;
  double dStack_ab8;
  double dStack_ab0;
  double dStack_aa8;
  double local_aa0;
  double dStack_a98;
  double dStack_a90;
  double dStack_a88;
  double local_a80;
  double dStack_a78;
  double dStack_a70;
  double dStack_a68;
  double local_a60;
  double dStack_a58;
  double dStack_a50;
  double dStack_a48;
  double local_a40;
  double dStack_a38;
  double dStack_a30;
  double dStack_a28;
  double local_a20;
  double dStack_a18;
  double dStack_a10;
  double dStack_a08;
  double local_a00;
  double dStack_9f8;
  double dStack_9f0;
  double dStack_9e8;
  double local_9e0;
  double dStack_9d8;
  double dStack_9d0;
  double dStack_9c8;
  double local_9c0;
  double dStack_9b8;
  double dStack_9b0;
  double dStack_9a8;
  double local_9a0;
  double dStack_998;
  double dStack_990;
  double dStack_988;
  double local_980;
  double dStack_978;
  double dStack_970;
  double dStack_968;
  double local_960;
  double dStack_958;
  double dStack_950;
  double dStack_948;
  double local_940;
  double dStack_938;
  double dStack_930;
  double dStack_928;
  double local_920;
  double dStack_918;
  double dStack_910;
  double dStack_908;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined1 (*local_798) [16];
  undefined1 (*local_790) [16];
  undefined1 (*local_788) [32];
  undefined1 (*local_780) [32];
  undefined1 (*local_778) [16];
  undefined1 local_770 [16];
  undefined8 *local_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  ulong local_730;
  undefined8 uStack_728;
  ulong *local_718;
  ulong local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  uint16_t *local_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  uint16_t *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  uint16_t *local_608;
  undefined1 local_600 [32];
  int *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined4 local_384;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [48];
  undefined1 local_280 [16];
  undefined1 auStack_270 [48];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_80 [32];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (in_R8D == 0x20) {
    local_fc0 = count;
    local_fc4 = 0x22;
    local_fe0 = count;
    local_fd8 = in_RDX;
    local_fd0 = in_RDI;
    for (local_fe4 = 0; local_fe4 < in_R9D; local_fe4 = local_fe4 + 1) {
      local_f88 = local_fd0;
      local_1020 = *(undefined8 *)*local_fd0;
      uStack_1018 = *(undefined8 *)(*local_fd0 + 8);
      uStack_1010 = *(undefined8 *)(*local_fd0 + 0x10);
      uStack_1008 = *(undefined8 *)(*local_fd0 + 0x18);
      local_f90 = local_fd8;
      local_1040 = *(undefined8 *)*local_fd8;
      uStack_1038 = *(undefined8 *)(*local_fd8 + 8);
      uStack_1030 = *(undefined8 *)(*local_fd8 + 0x10);
      uStack_1028 = *(undefined8 *)(*local_fd8 + 0x18);
      local_1080 = vpmaxub_avx2(*local_fd0,*local_fd8);
      auVar57 = local_1080;
      local_1060 = vpminub_avx2(*local_fd0,*local_fd8);
      local_520 = local_1080._0_8_;
      uStack_518 = local_1080._8_8_;
      uStack_510 = local_1080._16_8_;
      uStack_508 = local_1080._24_8_;
      local_540 = local_1060._0_8_;
      uStack_538 = local_1060._8_8_;
      uStack_530 = local_1060._16_8_;
      uStack_528 = local_1060._24_8_;
      _local_10a0 = vpsubusb_avx2(local_1080,local_1060);
      auVar6 = _local_10a0;
      local_f00 = local_10a0._0_8_;
      uStack_ef8 = local_10a0._8_8_;
      uStack_ef0 = local_10a0._16_8_;
      uStack_ee8 = uStack_1088;
      uStack_1128 = uStack_1088;
      local_1130 = local_10a0._16_8_;
      local_10c0 = vpmovzxbw_avx2(stack0xffffffffffffef70);
      auVar5._8_8_ = uStack_1138;
      auVar5._0_8_ = local_1140;
      local_10e0 = vpmovzxbw_avx2(auVar5);
      local_f40 = local_10c0._0_8_;
      uStack_f38 = local_10c0._8_8_;
      uStack_f30 = local_10c0._16_8_;
      uStack_f28 = local_10c0._24_8_;
      local_1100 = vpmullw_avx2(local_10c0,local_10c0);
      local_f80 = local_10e0._0_8_;
      uStack_f78 = local_10e0._8_8_;
      uStack_f70 = local_10e0._16_8_;
      uStack_f68 = local_10e0._24_8_;
      local_1120 = vpmullw_avx2(local_10e0,local_10e0);
      local_608 = local_fe0;
      local_640 = local_1100._0_8_;
      uStack_638 = local_1100._8_8_;
      uStack_630 = local_1100._16_8_;
      uStack_628 = local_1100._24_8_;
      *(undefined8 *)local_fe0 = local_1100._0_8_;
      *(undefined8 *)(local_fe0 + 4) = local_1100._8_8_;
      *(undefined8 *)(local_fe0 + 8) = local_1100._16_8_;
      *(undefined8 *)(local_fe0 + 0xc) = local_1100._24_8_;
      local_648 = local_fe0 + 0x10;
      local_680 = local_1120._0_8_;
      uStack_678 = local_1120._8_8_;
      uStack_670 = local_1120._16_8_;
      uStack_668 = local_1120._24_8_;
      *(undefined8 *)local_648 = local_1120._0_8_;
      *(undefined8 *)(local_fe0 + 0x14) = local_1120._8_8_;
      *(undefined8 *)(local_fe0 + 0x18) = local_1120._16_8_;
      *(undefined8 *)(local_fe0 + 0x1c) = local_1120._24_8_;
      local_ed0 = 0;
      local_4b0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_ec8 = local_4b0._8_8_;
      local_ee0._8_8_ = 0;
      local_ee0._0_8_ = local_4b0._8_8_;
      local_ee0 = local_ee0 << 0x40;
      local_608[0x20] = 0;
      local_608[0x21] = 0;
      local_fd0 = (undefined1 (*) [32])(*local_fd0 + in_ESI);
      local_fd8 = (undefined1 (*) [32])(*local_fd8 + in_ECX);
      local_fe0 = local_fe0 + 0x22;
      _local_10a0 = auVar6;
      local_1080 = auVar57;
      local_f60 = local_f80;
      uStack_f58 = uStack_f78;
      uStack_f50 = uStack_f70;
      uStack_f48 = uStack_f68;
      local_f20 = local_f40;
      uStack_f18 = uStack_f38;
      uStack_f10 = uStack_f30;
      uStack_f08 = uStack_f28;
      local_5c0 = local_1040;
      uStack_5b8 = uStack_1038;
      uStack_5b0 = uStack_1030;
      uStack_5a8 = uStack_1028;
      local_5a0 = local_1020;
      uStack_598 = uStack_1018;
      uStack_590 = uStack_1010;
      uStack_588 = uStack_1008;
      local_580 = local_1040;
      uStack_578 = uStack_1038;
      uStack_570 = uStack_1030;
      uStack_568 = uStack_1028;
      local_560 = local_1020;
      uStack_558 = uStack_1018;
      uStack_550 = uStack_1010;
      uStack_548 = uStack_1008;
      local_4d0 = local_1130;
      uStack_4c8 = uStack_1128;
      local_4b0 = ZEXT816(0) << 0x20;
    }
  }
  else {
    local_df0 = count;
    local_df4 = 0x22;
    local_e10 = count;
    local_e08 = in_RDX;
    local_e00 = in_RDI;
    for (local_e14 = 0; local_e14 < in_R9D; local_e14 = local_e14 + 1) {
      local_780 = local_e00;
      local_e30 = *(undefined8 *)*local_e00;
      uStack_e28 = *(undefined8 *)(*local_e00 + 8);
      local_788 = local_e08;
      local_e40 = *(undefined8 *)*local_e08;
      uStack_e38 = *(undefined8 *)(*local_e08 + 8);
      local_e60 = vpmovzxbw_avx2(*(undefined1 (*) [16])*local_e00);
      local_e80 = vpmovzxbw_avx2(*(undefined1 (*) [16])*local_e08);
      local_da0 = local_e60._0_8_;
      uStack_d98 = local_e60._8_8_;
      uStack_d90 = local_e60._16_8_;
      uStack_d88 = local_e60._24_8_;
      local_dc0 = local_e80._0_8_;
      uStack_db8 = local_e80._8_8_;
      uStack_db0 = local_e80._16_8_;
      uStack_da8 = local_e80._24_8_;
      local_ea0 = vpsubw_avx2(local_e60,local_e80);
      local_d80 = local_ea0._0_8_;
      uStack_d78 = local_ea0._8_8_;
      uStack_d70 = local_ea0._16_8_;
      uStack_d68 = local_ea0._24_8_;
      local_ec0 = vpmullw_avx2(local_ea0,local_ea0);
      local_688 = local_e10;
      local_6c0 = local_ec0._0_8_;
      uStack_6b8 = local_ec0._8_8_;
      uStack_6b0 = local_ec0._16_8_;
      uStack_6a8 = local_ec0._24_8_;
      *(undefined8 *)local_e10 = local_ec0._0_8_;
      *(undefined8 *)(local_e10 + 4) = local_ec0._8_8_;
      *(undefined8 *)(local_e10 + 8) = local_ec0._16_8_;
      *(undefined8 *)(local_e10 + 0xc) = local_ec0._24_8_;
      local_d30 = 0;
      local_4c0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_d28 = local_4c0._8_8_;
      local_d40._8_8_ = 0;
      local_d40._0_8_ = local_4c0._8_8_;
      local_d40 = local_d40 << 0x40;
      local_688[0x10] = 0;
      local_688[0x11] = 0;
      local_e00 = (undefined1 (*) [32])(*local_e00 + in_ESI);
      local_e08 = (undefined1 (*) [32])(*local_e08 + in_ECX);
      local_e10 = local_e10 + 0x22;
      local_d60 = local_d80;
      uStack_d58 = uStack_d78;
      uStack_d50 = uStack_d70;
      uStack_d48 = uStack_d68;
      local_500 = local_e40;
      uStack_4f8 = uStack_e38;
      local_4f0 = local_e30;
      uStack_4e8 = uStack_e28;
      local_4c0 = ZEXT816(0) << 0x20;
    }
  }
  for (local_2384 = 0; local_2384 < in_R8D; local_2384 = local_2384 + 4) {
    in_stack_ffffffffffffd638 = (undefined1 (*) [16])count;
    if (local_2384 != 0) {
      in_stack_ffffffffffffd638 = (undefined1 (*) [16])(count + (long)local_2384 + -2);
    }
    local_2390 = in_stack_ffffffffffffd638;
    for (local_2394 = 2; local_2394 < 5; local_2394 = local_2394 + 1) {
      local_ce8 = local_2390;
      local_cec = local_2384;
      local_798 = local_2390;
      local_d00 = *local_2390;
      if (local_2384 == 0) {
        local_4a0 = 0x302010001000100;
        uStack_498 = 0xb0a090807060504;
        auVar45._8_8_ = 0xb0a090807060504;
        auVar45._0_8_ = 0x302010001000100;
        local_d00 = vpshufb_avx(*local_2390,auVar45);
        local_490 = *(undefined8 *)*local_2390;
        uStack_488 = *(undefined8 *)(*local_2390 + 8);
      }
      if (local_2384 == in_R8D + -4) {
        local_470 = local_d00._0_8_;
        uStack_468 = local_d00._8_8_;
        local_480 = 0x706050403020100;
        uStack_478 = 0xb0a0b0a0b0a0908;
        auVar2._8_8_ = 0xb0a0b0a0b0a0908;
        auVar2._0_8_ = 0x706050403020100;
        local_d00 = vpshufb_avx(local_d00,auVar2);
      }
      local_420 = local_d00._0_8_;
      uStack_418 = local_d00._8_8_;
      auVar6 = vpmovzxwd_avx2(local_d00);
      *(undefined1 (*) [32])(local_2380 + (long)local_2394 * 4) = auVar6;
      local_2390 = (undefined1 (*) [16])(local_2390[4] + 4);
    }
    local_2380[0] = local_2380[8];
    local_2380[1] = local_2380[9];
    local_2380[2] = local_2380[10];
    local_2380[3] = local_2380[0xb];
    for (local_2398 = 0; local_2398 < in_R9D; local_2398 = local_2398 + 1) {
      local_1280 = 0;
      uStack_1278 = 0;
      uStack_1270 = 0;
      uStack_1268 = 0;
      local_23c0 = ZEXT1632(ZEXT816(0));
      local_23c4 = 0;
      while( true ) {
        if (4 < local_23c4) break;
        local_11a0 = local_23c0._0_8_;
        uStack_1198 = local_23c0._8_8_;
        uStack_1190 = local_23c0._16_8_;
        uStack_1188 = local_23c0._24_8_;
        lVar41 = (long)local_23c4;
        local_11c0 = local_2380[lVar41 * 4];
        uStack_11b8 = local_2380[lVar41 * 4 + 1];
        uStack_11b0 = local_2380[lVar41 * 4 + 2];
        uStack_11a8 = local_2380[lVar41 * 4 + 3];
        auVar6._8_8_ = uStack_11b8;
        auVar6._0_8_ = local_11c0;
        auVar6._16_8_ = uStack_11b0;
        auVar6._24_8_ = uStack_11a8;
        local_23c0 = vpaddd_avx2(local_23c0,auVar6);
        local_23c4 = local_23c4 + 1;
      }
      for (local_23c8 = 0; local_23c8 < 4; local_23c8 = local_23c8 + 1) {
        lVar41 = (long)(local_23c8 + 1);
        uVar7 = local_2380[lVar41 * 4 + 1];
        uVar8 = local_2380[lVar41 * 4 + 2];
        uVar9 = local_2380[lVar41 * 4 + 3];
        lVar42 = (long)local_23c8;
        local_2380[lVar42 * 4] = local_2380[lVar41 * 4];
        local_2380[lVar42 * 4 + 1] = uVar7;
        local_2380[lVar42 * 4 + 2] = uVar8;
        local_2380[lVar42 * 4 + 3] = uVar9;
      }
      if (in_R9D + -4 < local_2398) {
        local_2300 = local_2320;
      }
      else {
        local_d08 = local_2390;
        local_d0c = local_2384;
        local_790 = local_2390;
        local_d20 = *local_2390;
        if (local_2384 == 0) {
          local_460 = 0x302010001000100;
          uStack_458 = 0xb0a090807060504;
          auVar3._8_8_ = 0xb0a090807060504;
          auVar3._0_8_ = 0x302010001000100;
          local_d20 = vpshufb_avx(*local_2390,auVar3);
          local_450 = *(undefined8 *)*local_2390;
          uStack_448 = *(undefined8 *)(*local_2390 + 8);
        }
        if (local_2384 == in_R8D + -4) {
          local_430 = local_d20._0_8_;
          uStack_428 = local_d20._8_8_;
          local_440 = 0x706050403020100;
          uStack_438 = 0xb0a0b0a0b0a0908;
          auVar4._8_8_ = 0xb0a0b0a0b0a0908;
          auVar4._0_8_ = 0x706050403020100;
          local_d20 = vpshufb_avx(local_d20,auVar4);
        }
        local_410 = local_d20._0_8_;
        uStack_408 = local_d20._8_8_;
        local_2300 = vpmovzxwd_avx2(local_d20);
        local_2390 = (undefined1 (*) [16])(local_2390[4] + 4);
      }
      for (local_23cc = 0; local_23cc < 4; local_23cc = local_23cc + 1) {
        local_c80 = local_23c0._0_8_;
        uStack_c78 = local_23c0._8_8_;
        uStack_c70 = local_23c0._16_8_;
        uStack_c68 = local_23c0._24_8_;
        local_c84 = local_23cc;
        lVar41 = (long)local_23cc;
        local_400 = *(undefined8 *)sse_bytemask[lVar41];
        uStack_3f8 = *(undefined8 *)(sse_bytemask[lVar41] + 2);
        uStack_3f0 = *(undefined8 *)(sse_bytemask[lVar41] + 4);
        uStack_3e8 = *(undefined8 *)(sse_bytemask[lVar41] + 6);
        local_3e0 = local_23c0._0_8_;
        uStack_3d8 = local_23c0._8_8_;
        uStack_3d0 = local_23c0._16_8_;
        uStack_3c8 = local_23c0._24_8_;
        _local_cc0 = vpand_avx2(local_23c0,(undefined1  [32])sse_bytemask[lVar41]);
        local_c60 = local_cc0._0_8_;
        uStack_c58 = local_cc0._8_8_;
        uStack_c50 = local_cc0._16_8_;
        uStack_c48 = uStack_ca8;
        uStack_bd8 = uStack_ca8;
        local_be0 = local_cc0._16_8_;
        local_bf0 = local_ce0._0_8_;
        uStack_be8 = local_ce0._8_8_;
        auVar5 = vpaddd_avx(stack0xfffffffffffff350,local_ce0);
        auVar45 = vpsrldq_avx(auVar5,8);
        local_cd0._0_8_ = auVar5._0_8_;
        local_cd0._8_8_ = auVar5._8_8_;
        local_ce0._0_8_ = auVar45._0_8_;
        local_ce0._8_8_ = auVar45._8_8_;
        local_c00 = local_cd0._0_8_;
        uStack_bf8 = local_cd0._8_8_;
        local_c10 = local_ce0._0_8_;
        uStack_c08 = local_ce0._8_8_;
        auVar5 = vpaddd_avx(auVar5,auVar45);
        local_ce0 = vpsrldq_avx(auVar5,4);
        local_cd0._0_8_ = auVar5._0_8_;
        local_cd0._8_8_ = auVar5._8_8_;
        local_c20 = local_cd0._0_8_;
        uStack_c18 = local_cd0._8_8_;
        local_c30 = local_ce0._0_8_;
        uStack_c28 = local_ce0._8_8_;
        local_cd0 = vpaddd_avx(auVar5,local_ce0);
        local_22d0[(long)local_2398 * 0x20 + (long)(local_2384 + local_23cc)] = local_cd0._0_4_;
      }
    }
  }
  for (local_2414 = 0; local_2414 < 4; local_2414 = local_2414 + 1) {
    (&local_23f0)[local_2414] =
         (double)*(int *)(in_stack_00000008 + (long)local_2414 * 4) * in_XMM2_Qa;
    (&local_2410)[local_2414] = *(double *)(luma_sse_sum + (long)local_2414 * 2) * in_XMM1_Qa;
  }
  local_12a4 = in_R9D;
  local_12a0 = in_R8D;
  local_129c = in_ECX;
  local_1298 = in_RDX;
  if ((int)d_factor == 0) {
    local_241c = 0;
    local_12c8 = in_XMM3_Qa;
    local_12b0 = in_XMM0_Qa;
    for (local_2418 = 0; local_2418 < local_12a4; local_2418 = local_2418 + 1) {
      local_2420 = (uint)(local_12a4 / 2 <= local_2418) << 1;
      for (local_2424 = 0; local_2424 < local_12a0; local_2424 = local_2424 + 1) {
        local_2428 = (uint)(byte)(*local_1298)[local_2418 * local_129c + local_2424];
        local_242c = local_22d0[(long)local_2418 * 0x20 + (long)local_2424] +
                     *(int *)(frame_sse + (long)(local_2418 * 0x20 + local_2424) * 2);
        local_2438 = (double)local_242c * local_12b0;
        local_243c = local_2420 + (uint)(local_12a0 / 2 <= local_2424);
        local_2448 = local_12c8 * local_2438 + (&local_23f0)[local_243c];
        local_29d8 = local_2448 * (&local_2410)[local_243c];
        if (7.0 <= local_29d8) {
          local_29d8 = 7.0;
        }
        local_2450 = local_29d8;
        dVar44 = exp(-local_29d8);
        local_2454 = (int)(dVar44 * 1000.0);
        *(short *)((long)accumulator + (long)local_241c * 2) =
             *(short *)((long)accumulator + (long)local_241c * 2) + (short)local_2454;
        subblock_mses[local_241c] = local_2454 * local_2428 + subblock_mses[local_241c];
        local_241c = local_241c + 1;
      }
    }
  }
  else {
    local_bc4 = 0;
    local_384 = 0;
    local_388 = 0;
    local_38c = 0;
    local_390 = 0;
    local_394 = 0;
    local_398 = 0;
    local_39c = 0;
    local_3a0 = 0;
    auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
    auVar45 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar45 = vinsertps_avx(auVar45,ZEXT416(0),0x20);
    auStack_3b0 = vinsertps_avx(auVar45,ZEXT416(0),0x30);
    local_3c0._0_8_ = auVar5._0_8_;
    uVar7 = local_3c0._0_8_;
    local_3c0._8_8_ = auVar5._8_8_;
    uVar8 = local_3c0._8_8_;
    uVar9 = auStack_3b0._0_8_;
    uVar18 = auStack_3b0._8_8_;
    local_bc8 = 0x3f000000;
    local_344 = 0x3f000000;
    local_348 = 0x3f000000;
    local_34c = 0x3f000000;
    local_350 = 0x3f000000;
    local_354 = 0x3f000000;
    local_358 = 0x3f000000;
    local_35c = 0x3f000000;
    local_360 = 0x3f000000;
    auVar45 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
    auVar45 = vinsertps_avx(auVar45,ZEXT416(0x3f000000),0x20);
    auVar45 = vinsertps_avx(auVar45,ZEXT416(0x3f000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
    local_380._0_8_ = auVar45._0_8_;
    uVar19 = local_380._0_8_;
    local_380._8_8_ = auVar45._8_8_;
    uVar20 = local_380._8_8_;
    auStack_370._0_8_ = auVar2._0_8_;
    uVar21 = auStack_370._0_8_;
    auStack_370._8_8_ = auVar2._8_8_;
    uVar22 = auStack_370._8_8_;
    local_bcc = 0x40e00000;
    local_304 = 0x40e00000;
    local_308 = 0x40e00000;
    local_30c = 0x40e00000;
    local_310 = 0x40e00000;
    local_314 = 0x40e00000;
    local_318 = 0x40e00000;
    local_31c = 0x40e00000;
    local_320 = 0x40e00000;
    auVar3 = vinsertps_avx(ZEXT416(0x40e00000),ZEXT416(0x40e00000),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40e00000),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40e00000),0x30);
    auVar4 = vinsertps_avx(ZEXT416(0x40e00000),ZEXT416(0x40e00000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40e00000),0x20);
    auStack_330 = vinsertps_avx(auVar4,ZEXT416(0x40e00000),0x30);
    local_340._0_8_ = auVar3._0_8_;
    uVar23 = local_340._0_8_;
    local_340._8_8_ = auVar3._8_8_;
    uVar24 = local_340._8_8_;
    uVar25 = auStack_330._0_8_;
    uVar26 = auStack_330._8_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = in_XMM0_Qa;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = in_XMM0_Qa;
    local_2c0 = vunpcklpd_avx(auVar46,auVar65);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = in_XMM0_Qa;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = in_XMM0_Qa;
    auStack_2b0._0_16_ = vunpcklpd_avx(auVar66,auVar84);
    uVar31 = local_2c0._0_8_;
    uVar32 = local_2c0._8_8_;
    uVar33 = auStack_2b0._0_8_;
    uVar34 = auStack_2b0._8_8_;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = in_XMM3_Qa;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = in_XMM3_Qa;
    local_280 = vunpcklpd_avx(auVar47,auVar67);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = in_XMM3_Qa;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = in_XMM3_Qa;
    auStack_270._0_16_ = vunpcklpd_avx(auVar68,auVar85);
    uVar35 = local_280._0_8_;
    uVar36 = local_280._8_8_;
    uVar37 = auStack_270._0_8_;
    uVar38 = auStack_270._8_8_;
    local_bd0 = 0x447a0000;
    local_2c4 = 0x447a0000;
    local_2c8 = 0x447a0000;
    local_2cc = 0x447a0000;
    local_2d0 = 0x447a0000;
    local_2d4 = 0x447a0000;
    local_2d8 = 0x447a0000;
    local_2dc = 0x447a0000;
    local_2e0 = 0x447a0000;
    auVar4 = vinsertps_avx(ZEXT416(0x447a0000),ZEXT416(0x447a0000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x447a0000),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x447a0000),0x30);
    auVar46 = vinsertps_avx(ZEXT416(0x447a0000),ZEXT416(0x447a0000),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416(0x447a0000),0x20);
    auVar46 = vinsertps_avx(auVar46,ZEXT416(0x447a0000),0x30);
    local_300._0_8_ = auVar4._0_8_;
    uVar27 = local_300._0_8_;
    local_300._8_8_ = auVar4._8_8_;
    uVar28 = local_300._8_8_;
    auStack_2f0._0_8_ = auVar46._0_8_;
    uVar29 = auStack_2f0._0_8_;
    auStack_2f0._8_8_ = auVar46._8_8_;
    uVar30 = auStack_2f0._8_8_;
    local_b88 = local_23f0;
    local_208 = local_23f0;
    local_210 = local_23f0;
    local_218 = local_23f0;
    local_220 = local_23f0;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_23f0;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_23f0;
    local_240 = vunpcklpd_avx(auVar48,auVar69);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = local_23f0;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_23f0;
    auStack_230 = vunpcklpd_avx(auVar70,auVar86);
    local_2560[0x10] = (double)local_240._0_8_;
    local_2560[0x11] = (double)local_240._8_8_;
    local_2560[0x12] = (double)auStack_230._0_8_;
    local_2560[0x13] = (double)auStack_230._8_8_;
    local_b90 = local_23e8;
    local_1c8 = local_23e8;
    local_1d0 = local_23e8;
    local_1d8 = local_23e8;
    local_1e0 = local_23e8;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_23e8;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_23e8;
    local_200 = vunpcklpd_avx(auVar49,auVar71);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = local_23e8;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_23e8;
    auStack_1f0 = vunpcklpd_avx(auVar72,auVar87);
    local_2560[0x14] = (double)local_200._0_8_;
    local_2560[0x15] = (double)local_200._8_8_;
    local_2560[0x16] = (double)auStack_1f0._0_8_;
    local_2560[0x17] = (double)auStack_1f0._8_8_;
    local_b98 = local_23e0;
    local_188 = local_23e0;
    local_190 = local_23e0;
    local_198 = local_23e0;
    local_1a0 = local_23e0;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_23e0;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_23e0;
    local_1c0 = vunpcklpd_avx(auVar50,auVar73);
    auVar88._8_8_ = 0;
    auVar88._0_8_ = local_23e0;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_23e0;
    auStack_1b0 = vunpcklpd_avx(auVar74,auVar88);
    local_2560[0x18] = (double)local_1c0._0_8_;
    local_2560[0x19] = (double)local_1c0._8_8_;
    local_2560[0x1a] = (double)auStack_1b0._0_8_;
    local_2560[0x1b] = (double)auStack_1b0._8_8_;
    local_ba0 = local_23d8;
    local_148 = local_23d8;
    local_150 = local_23d8;
    local_158 = local_23d8;
    local_160 = local_23d8;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_23d8;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_23d8;
    local_180 = vunpcklpd_avx(auVar51,auVar75);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = local_23d8;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_23d8;
    auStack_170 = vunpcklpd_avx(auVar76,auVar89);
    local_2560[0x1c] = (double)local_180._0_8_;
    local_2560[0x1d] = (double)local_180._8_8_;
    local_2560[0x1e] = (double)auStack_170._0_8_;
    local_2560[0x1f] = (double)auStack_170._8_8_;
    local_ba8 = local_2410;
    local_108 = local_2410;
    local_110 = local_2410;
    local_118 = local_2410;
    local_120 = local_2410;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_2410;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_2410;
    local_140 = vunpcklpd_avx(auVar52,auVar77);
    auVar90._8_8_ = 0;
    auVar90._0_8_ = local_2410;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_2410;
    auStack_130 = vunpcklpd_avx(auVar78,auVar90);
    local_2560[0] = (double)local_140._0_8_;
    local_2560[1] = (double)local_140._8_8_;
    local_2560[2] = (double)auStack_130._0_8_;
    local_2560[3] = (double)auStack_130._8_8_;
    local_bb0 = local_2408;
    local_c8 = local_2408;
    local_d0 = local_2408;
    local_d8 = local_2408;
    local_e0 = local_2408;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_2408;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_2408;
    local_100 = vunpcklpd_avx(auVar53,auVar79);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = local_2408;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = local_2408;
    auStack_f0 = vunpcklpd_avx(auVar80,auVar91);
    local_2560[4] = (double)local_100._0_8_;
    local_2560[5] = (double)local_100._8_8_;
    local_2560[6] = (double)auStack_f0._0_8_;
    local_2560[7] = (double)auStack_f0._8_8_;
    local_bb8 = local_2400;
    local_88 = local_2400;
    local_90 = local_2400;
    local_98 = local_2400;
    local_a0 = local_2400;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = local_2400;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_2400;
    local_c0 = vunpcklpd_avx(auVar54,auVar81);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = local_2400;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_2400;
    auStack_b0 = vunpcklpd_avx(auVar82,auVar92);
    local_2560[8] = (double)local_c0._0_8_;
    local_2560[9] = (double)local_c0._8_8_;
    local_2560[10] = (double)auStack_b0._0_8_;
    local_2560[0xb] = (double)auStack_b0._8_8_;
    local_bc0 = local_23f8;
    local_38 = local_23f8;
    local_40 = local_23f8;
    local_48 = local_23f8;
    local_50 = local_23f8;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = local_23f8;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_23f8;
    auVar47 = vunpcklpd_avx(auVar55,auVar83);
    auVar93._8_8_ = 0;
    auVar93._0_8_ = local_23f8;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_23f8;
    auVar48 = vunpcklpd_avx(auVar56,auVar93);
    auVar57._16_16_ = auVar47;
    auVar57._0_16_ = auVar48;
    local_80._0_8_ = auVar48._0_8_;
    local_80._8_8_ = auVar48._8_8_;
    local_80._16_8_ = auVar47._0_8_;
    local_80._24_8_ = auVar47._8_8_;
    local_2560[0xc] = (double)local_80._0_8_;
    local_2560[0xd] = (double)local_80._8_8_;
    local_2560[0xe] = (double)local_80._16_8_;
    local_2560[0xf] = (double)local_80._24_8_;
    local_3c0 = auVar5;
    local_380 = auVar45;
    auStack_370 = auVar2;
    local_340 = auVar3;
    local_300 = auVar4;
    auStack_2f0 = auVar46;
    local_80 = auVar57;
    for (local_2624 = 0; local_2624 < local_12a4; local_2624 = local_2624 + 1) {
      iVar40 = local_12a4 / 2;
      for (local_2634 = 0; local_2634 < local_12a0; local_2634 = local_2634 + 8) {
        local_b68 = (undefined1 (*) [32])(local_22d0 + (long)local_2624 * 0x20 + (long)local_2634);
        auVar6 = vlddqu_avx(*local_b68);
        local_b70 = (undefined1 (*) [32])
                    (frame_sse + (long)(local_2624 << 5) * 2 + (long)local_2634 * 2);
        auVar57 = vlddqu_avx(*local_b70);
        local_2660 = auVar6._0_8_;
        uStack_2658 = auVar6._8_8_;
        uStack_2650 = auVar6._16_8_;
        uStack_2648 = auVar6._24_8_;
        local_2680 = auVar57._0_8_;
        uStack_2678 = auVar57._8_8_;
        uStack_2670 = auVar57._16_8_;
        uStack_2668 = auVar57._24_8_;
        local_11e0 = local_2660;
        uStack_11d8 = uStack_2658;
        uStack_11d0 = uStack_2650;
        uStack_11c8 = uStack_2648;
        local_1200 = local_2680;
        uStack_11f8 = uStack_2678;
        uStack_11f0 = uStack_2670;
        uStack_11e8 = uStack_2668;
        auVar6 = vpaddd_avx2(auVar6,auVar57);
        local_26a0 = auVar6._0_8_;
        uStack_2698 = auVar6._8_8_;
        uStack_2690 = auVar6._16_8_;
        uStack_2688 = auVar6._24_8_;
        local_1160 = local_26a0;
        uStack_1158 = uStack_2698;
        uStack_1150 = uStack_2690;
        uStack_1148 = uStack_2688;
        auVar6 = vcvtdq2pd_avx(auVar6._0_16_);
        uStack_b48 = uStack_2688;
        local_b50 = uStack_2690;
        auVar57 = vcvtdq2pd_avx(local_b60);
        local_26c0 = auVar6._0_8_;
        dStack_26b8 = auVar6._8_8_;
        dStack_26b0 = auVar6._16_8_;
        dStack_26a8 = auVar6._24_8_;
        local_9e0 = local_26c0;
        dStack_9d8 = dStack_26b8;
        dStack_9d0 = dStack_26b0;
        dStack_9c8 = dStack_26a8;
        local_a00 = (double)uVar31;
        dStack_9f8 = (double)uVar32;
        dStack_9f0 = (double)uVar33;
        dStack_9e8 = (double)uVar34;
        local_a60 = local_26c0 * (double)uVar31;
        dStack_a58 = dStack_26b8 * (double)uVar32;
        dStack_a50 = dStack_26b0 * (double)uVar33;
        dStack_a48 = dStack_26a8 * (double)uVar34;
        local_26e0 = auVar57._0_8_;
        dStack_26d8 = auVar57._8_8_;
        dStack_26d0 = auVar57._16_8_;
        dStack_26c8 = auVar57._24_8_;
        local_a20 = local_26e0;
        dStack_a18 = dStack_26d8;
        dStack_a10 = dStack_26d0;
        dStack_a08 = dStack_26c8;
        local_a40 = (double)uVar31;
        dStack_a38 = (double)uVar32;
        dStack_a30 = (double)uVar33;
        dStack_a28 = (double)uVar34;
        local_aa0 = local_26e0 * (double)uVar31;
        dStack_a98 = dStack_26d8 * (double)uVar32;
        dStack_a90 = dStack_26d0 * (double)uVar33;
        dStack_a88 = dStack_26c8 * (double)uVar34;
        iVar39 = (uint)(iVar40 <= local_2624) * 2 + (uint)(local_12a0 / 2 <= local_2634);
        lVar41 = (long)iVar39;
        local_9c0 = local_2560[lVar41 * 4 + 0x10];
        dStack_9b8 = local_2560[lVar41 * 4 + 0x11];
        dStack_9b0 = local_2560[lVar41 * 4 + 0x12];
        dStack_9a8 = local_2560[lVar41 * 4 + 0x13];
        local_a80 = (double)uVar35;
        dStack_a78 = (double)uVar36;
        dStack_a70 = (double)uVar37;
        dStack_a68 = (double)uVar38;
        local_960 = local_a60 * (double)uVar35;
        dStack_958 = dStack_a58 * (double)uVar36;
        dStack_950 = dStack_a50 * (double)uVar37;
        dStack_948 = dStack_a48 * (double)uVar38;
        local_ae0 = local_960 + local_9c0;
        dStack_ad8 = dStack_958 + dStack_9b8;
        dStack_ad0 = dStack_950 + dStack_9b0;
        dStack_ac8 = dStack_948 + dStack_9a8;
        local_ac0 = (double)uVar35;
        dStack_ab8 = (double)uVar36;
        dStack_ab0 = (double)uVar37;
        dStack_aa8 = (double)uVar38;
        local_9a0 = local_aa0 * (double)uVar35;
        dStack_998 = dStack_a98 * (double)uVar36;
        dStack_990 = dStack_a90 * (double)uVar37;
        dStack_988 = dStack_a88 * (double)uVar38;
        local_b20 = local_9a0 + local_9c0;
        dStack_b18 = dStack_998 + dStack_9b8;
        dStack_b10 = dStack_990 + dStack_9b0;
        dStack_b08 = dStack_988 + dStack_9a8;
        lVar41 = (long)iVar39;
        local_b40 = local_2560[lVar41 * 4];
        dStack_b38 = local_2560[lVar41 * 4 + 1];
        dStack_b30 = local_2560[lVar41 * 4 + 2];
        dStack_b28 = local_2560[lVar41 * 4 + 3];
        local_920 = local_ae0 * local_b40;
        dStack_918 = dStack_ad8 * dStack_b38;
        dStack_910 = dStack_ad0 * dStack_b30;
        dStack_908 = dStack_ac8 * dStack_b28;
        local_940 = local_b20 * local_b40;
        dStack_938 = dStack_b18 * dStack_b38;
        dStack_930 = dStack_b10 * dStack_b30;
        dStack_928 = dStack_b08 * dStack_b28;
        auVar11._8_8_ = dStack_918;
        auVar11._0_8_ = local_920;
        auVar11._16_8_ = dStack_910;
        auVar11._24_8_ = dStack_908;
        auVar47 = vcvtpd2ps_avx(auVar11);
        auVar10._8_8_ = dStack_938;
        auVar10._0_8_ = local_940;
        auVar10._16_8_ = dStack_930;
        auVar10._24_8_ = dStack_928;
        auVar48 = vcvtpd2ps_avx(auVar10);
        local_2810 = auVar47._0_8_;
        uStack_2808 = auVar47._8_8_;
        local_8f0 = local_2810;
        uStack_8e8 = uStack_2808;
        local_2820 = auVar48._0_8_;
        uStack_2818 = auVar48._8_8_;
        local_8c0 = local_2810;
        uStack_8b8 = uStack_2808;
        uStack_8b0 = local_2820;
        uStack_8a8 = uStack_2818;
        local_8e0 = uVar23;
        uStack_8d8 = uVar24;
        uStack_8d0 = uVar25;
        uStack_8c8 = uVar26;
        auVar13._16_8_ = local_2820;
        auVar13._0_16_ = auVar47;
        auVar13._24_8_ = uStack_2818;
        auVar12._16_8_ = uVar25;
        auVar12._0_16_ = auVar3;
        auVar12._24_8_ = uVar26;
        auVar6 = vminps_avx(auVar13,auVar12);
        local_2860 = auVar6._0_8_;
        uStack_2858 = auVar6._8_8_;
        uStack_2850 = auVar6._16_8_;
        uStack_2848 = auVar6._24_8_;
        local_880 = uVar7;
        uStack_878 = uVar8;
        uStack_870 = uVar9;
        uStack_868 = uVar18;
        local_8a0 = local_2860;
        uStack_898 = uStack_2858;
        uStack_890 = uStack_2850;
        uStack_888 = uStack_2848;
        auVar14._16_8_ = uVar9;
        auVar14._0_16_ = auVar5;
        auVar14._24_8_ = uVar18;
        auVar6 = vsubps_avx(auVar14,auVar6);
        local_2880 = auVar6._0_8_;
        uStack_2878 = auVar6._8_8_;
        uStack_2870 = auVar6._16_8_;
        uStack_2868 = auVar6._24_8_;
        y[2] = (float)(int)in_stack_ffffffffffffd640;
        y[3] = (float)(int)((ulong)in_stack_ffffffffffffd640 >> 0x20);
        y._0_8_ = in_stack_ffffffffffffd638;
        y[4] = (float)(int)in_stack_ffffffffffffd648;
        y[5] = (float)(int)((ulong)in_stack_ffffffffffffd648 >> 0x20);
        y[6] = (float)(int)in_stack_ffffffffffffd650;
        y[7] = (float)(int)((ulong)in_stack_ffffffffffffd650 >> 0x20);
        local_b00 = local_b40;
        dStack_af8 = dStack_b38;
        dStack_af0 = dStack_b30;
        dStack_ae8 = dStack_b28;
        local_980 = local_9c0;
        dStack_978 = dStack_9b8;
        dStack_970 = dStack_9b0;
        dStack_968 = dStack_9a8;
        approx_exp_avx2(y);
        local_840._0_4_ = (float)local_2880;
        local_840._4_4_ = (float)((ulong)local_2880 >> 0x20);
        uStack_838._0_4_ = (float)uStack_2878;
        uStack_838._4_4_ = (float)((ulong)uStack_2878 >> 0x20);
        uStack_830._0_4_ = (float)uStack_2870;
        uStack_830._4_4_ = (float)((ulong)uStack_2870 >> 0x20);
        uStack_828._0_4_ = (float)uStack_2868;
        uStack_828._4_4_ = (float)((ulong)uStack_2868 >> 0x20);
        local_860._0_4_ = auVar4._0_4_;
        local_860._4_4_ = auVar4._4_4_;
        uStack_858._0_4_ = auVar4._8_4_;
        uStack_858._4_4_ = auVar4._12_4_;
        uStack_850._0_4_ = auVar46._0_4_;
        uStack_850._4_4_ = auVar46._4_4_;
        uStack_848._0_4_ = auVar46._8_4_;
        local_800 = CONCAT44(local_840._4_4_ * local_860._4_4_,(float)local_840 * (float)local_860);
        uStack_7f8 = CONCAT44(uStack_838._4_4_ * uStack_858._4_4_,
                              (float)uStack_838 * (float)uStack_858);
        uStack_7f0 = CONCAT44(uStack_830._4_4_ * uStack_850._4_4_,
                              (float)uStack_830 * (float)uStack_850);
        uStack_7e8 = CONCAT44(uStack_828._4_4_,(float)uStack_828 * (float)uStack_848);
        local_820._0_4_ = auVar45._0_4_;
        local_820._4_4_ = auVar45._4_4_;
        uStack_818._0_4_ = auVar45._8_4_;
        uStack_818._4_4_ = auVar45._12_4_;
        uStack_810._0_4_ = auVar2._0_4_;
        uStack_810._4_4_ = auVar2._4_4_;
        uStack_808._0_4_ = auVar2._8_4_;
        uStack_808._4_4_ = auVar2._12_4_;
        local_820._0_4_ = (float)local_840 * (float)local_860 + (float)local_820;
        local_820._4_4_ = local_840._4_4_ * local_860._4_4_ + local_820._4_4_;
        uStack_818._0_4_ = (float)uStack_838 * (float)uStack_858 + (float)uStack_818;
        uStack_818._4_4_ = uStack_838._4_4_ * uStack_858._4_4_ + uStack_818._4_4_;
        uStack_810._0_4_ = (float)uStack_830 * (float)uStack_850 + (float)uStack_810;
        uStack_810._4_4_ = uStack_830._4_4_ * uStack_850._4_4_ + uStack_810._4_4_;
        uStack_808._0_4_ = (float)uStack_828 * (float)uStack_848 + (float)uStack_808;
        local_7e0 = CONCAT44(local_820._4_4_,(float)local_820);
        uStack_7d8 = CONCAT44(uStack_818._4_4_,(float)uStack_818);
        uStack_7d0 = CONCAT44(uStack_810._4_4_,(float)uStack_810);
        uStack_7c8 = CONCAT44(uStack_828._4_4_ + uStack_808._4_4_,(float)uStack_808);
        iVar43 = (int)(float)local_820;
        iVar58 = (int)local_820._4_4_;
        iVar59 = (int)(float)uStack_818;
        iVar60 = (int)uStack_818._4_4_;
        iVar61 = (int)(float)uStack_810;
        iVar62 = (int)uStack_810._4_4_;
        iVar63 = (int)(float)uStack_808;
        iVar64 = (int)(uStack_828._4_4_ + uStack_808._4_4_);
        local_1180 = CONCAT44(iVar58,iVar43);
        uStack_1178 = CONCAT44(iVar60,iVar59);
        uStack_1170 = CONCAT44(iVar62,iVar61);
        uStack_1168 = CONCAT44(iVar64,iVar63);
        local_7c0 = CONCAT44(iVar62,iVar61);
        uStack_7b8 = CONCAT44(iVar64,iVar63);
        auVar16._8_8_ = uStack_1178;
        auVar16._0_8_ = local_1180;
        auVar15._8_8_ = uStack_7b8;
        auVar15._0_8_ = local_7c0;
        auVar47 = vpackusdw_avx(auVar16,auVar15);
        iVar39 = local_2624 * local_129c + local_2634;
        local_778 = (undefined1 (*) [16])((long)accumulator + (long)iVar39 * 2);
        local_740 = *(undefined8 *)*local_778;
        uStack_738 = *(undefined8 *)(*local_778 + 8);
        local_758 = (undefined8 *)((long)accumulator + (long)iVar39 * 2);
        local_2910 = auVar47._0_8_;
        local_750 = local_2910;
        uStack_2908 = auVar47._8_8_;
        uStack_748 = uStack_2908;
        local_770 = vpaddw_avx(*local_778,auVar47);
        *local_758 = local_770._0_8_;
        local_758[1] = local_770._8_8_;
        local_1248 = (undefined1 (*) [32])(subblock_mses + iVar39);
        local_1220 = *(undefined8 *)*local_1248;
        uStack_1218 = *(undefined8 *)(*local_1248 + 8);
        uStack_1210 = *(undefined8 *)(*local_1248 + 0x10);
        uStack_1208 = *(undefined8 *)(*local_1248 + 0x18);
        local_718 = (ulong *)(*local_1298 + iVar39);
        local_730 = *local_718;
        uStack_728 = 0;
        uStack_708 = 0;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_730;
        auVar6 = vpmovzxbd_avx2(auVar1);
        local_29a0 = auVar6._0_8_;
        local_6e0 = local_29a0;
        uStack_2998 = auVar6._8_8_;
        uStack_6d8 = uStack_2998;
        uStack_2990 = auVar6._16_8_;
        uStack_6d0 = uStack_2990;
        uStack_2988 = auVar6._24_8_;
        uStack_6c8 = uStack_2988;
        local_700 = CONCAT44(iVar58,iVar43);
        uStack_6f8 = CONCAT44(iVar60,iVar59);
        uStack_6f0 = CONCAT44(iVar62,iVar61);
        uStack_6e8 = CONCAT44(iVar64,iVar63);
        auVar17._8_8_ = uStack_6f8;
        auVar17._0_8_ = local_700;
        auVar17._16_8_ = uStack_6f0;
        auVar17._24_8_ = uStack_6e8;
        auVar6 = vpmulld_avx2(auVar6,auVar17);
        in_stack_ffffffffffffd640 = auVar6._0_8_;
        in_stack_ffffffffffffd648 = auVar6._8_8_;
        in_stack_ffffffffffffd650 = auVar6._16_8_;
        uStack_29a8 = auVar6._24_8_;
        local_5c8 = subblock_mses + iVar39;
        uStack_1228 = uStack_29a8;
        local_600 = vpaddd_avx2(*local_1248,auVar6);
        *(undefined8 *)local_5c8 = local_600._0_8_;
        *(undefined8 *)(local_5c8 + 2) = local_600._8_8_;
        *(undefined8 *)(local_5c8 + 4) = local_600._16_8_;
        *(undefined8 *)(local_5c8 + 6) = local_600._24_8_;
        local_1240 = in_stack_ffffffffffffd640;
        uStack_1238 = in_stack_ffffffffffffd648;
        uStack_1230 = in_stack_ffffffffffffd650;
        local_860 = uVar27;
        uStack_858 = uVar28;
        uStack_850 = uVar29;
        uStack_848 = uVar30;
        local_840 = local_2880;
        uStack_838 = uStack_2878;
        uStack_830 = uStack_2870;
        uStack_828 = uStack_2868;
        local_820 = uVar19;
        uStack_818 = uVar20;
        uStack_810 = uVar21;
        uStack_808 = uVar22;
        local_7b0 = local_1180;
        uStack_7a8 = uStack_1178;
        local_710 = local_730;
      }
    }
  }
  return;
}

Assistant:

static void apply_temporal_filter(
    const uint8_t *frame1, const unsigned int stride, const uint8_t *frame2,
    const unsigned int stride2, const int block_width, const int block_height,
    const int *subblock_mses, unsigned int *accumulator, uint16_t *count,
    uint16_t *frame_sse, uint32_t *luma_sse_sum,
    const double inv_num_ref_pixels, const double decay_factor,
    const double inv_factor, const double weight_factor, double *d_factor,
    int tf_wgt_calc_lvl) {
  assert(((block_width == 16) || (block_width == 32)) &&
         ((block_height == 16) || (block_height == 32)));

  uint32_t acc_5x5_sse[BH][BW];

  get_squared_error(frame1, stride, frame2, stride2, block_width, block_height,
                    frame_sse, SSE_STRIDE);

  __m128i vsrc[5][2];

  // Traverse 4 columns at a time
  // First and last columns will require padding
  for (int col = 0; col < block_width; col += 4) {
    uint16_t *src = frame_sse + col;

    // Load and pad(for first and last col) 3 rows from the top
    for (int i = 2; i < 5; i++) {
      xx_load_and_pad(src, vsrc[i], col, block_width);
      src += SSE_STRIDE;
    }

    // Padding for top 2 rows
    vsrc[0][0] = vsrc[2][0];
    vsrc[0][1] = vsrc[2][1];
    vsrc[1][0] = vsrc[2][0];
    vsrc[1][1] = vsrc[2][1];

    for (int row = 0; row < block_height; row++) {
      __m128i vsum1 = _mm_setzero_si128();
      __m128i vsum2 = _mm_setzero_si128();

      // Add 5 consecutive rows
      for (int i = 0; i < 5; i++) {
        vsum1 = _mm_add_epi32(vsrc[i][0], vsum1);
        vsum2 = _mm_add_epi32(vsrc[i][1], vsum2);
      }

      // Push all elements by one element to the top
      for (int i = 0; i < 4; i++) {
        vsrc[i][0] = vsrc[i + 1][0];
        vsrc[i][1] = vsrc[i + 1][1];
      }

      if (row <= block_height - 4) {
        // Load next row
        xx_load_and_pad(src, vsrc[4], col, block_width);
        src += SSE_STRIDE;
      } else {
        // Padding for bottom 2 rows
        vsrc[4][0] = vsrc[3][0];
        vsrc[4][1] = vsrc[3][1];
      }

      // Accumulate the sum horizontally
      for (int i = 0; i < 4; i++) {
        acc_5x5_sse[row][col + i] = xx_mask_and_hadd(vsum1, vsum2, i);
      }
    }
  }

  double subblock_mses_scaled[4];
  double d_factor_decayed[4];
  for (int idx = 0; idx < 4; idx++) {
    subblock_mses_scaled[idx] = subblock_mses[idx] * inv_factor;
    d_factor_decayed[idx] = d_factor[idx] * decay_factor;
  }
  if (tf_wgt_calc_lvl == 0) {
    for (int i = 0, k = 0; i < block_height; i++) {
      const int y_blk_raster_offset = (i >= block_height / 2) * 2;
      for (int j = 0; j < block_width; j++, k++) {
        const int pixel_value = frame2[i * stride2 + j];
        uint32_t diff_sse = acc_5x5_sse[i][j] + luma_sse_sum[i * BW + j];

        const double window_error = diff_sse * inv_num_ref_pixels;
        const int subblock_idx = y_blk_raster_offset + (j >= block_width / 2);
        const double combined_error =
            weight_factor * window_error + subblock_mses_scaled[subblock_idx];

        double scaled_error = combined_error * d_factor_decayed[subblock_idx];
        scaled_error = AOMMIN(scaled_error, 7);
        const int weight = (int)(exp(-scaled_error) * TF_WEIGHT_SCALE);

        count[k] += weight;
        accumulator[k] += weight * pixel_value;
      }
    }
  } else {
    for (int i = 0, k = 0; i < block_height; i++) {
      const int y_blk_raster_offset = (i >= block_height / 2) * 2;
      for (int j = 0; j < block_width; j++, k++) {
        const int pixel_value = frame2[i * stride2 + j];
        uint32_t diff_sse = acc_5x5_sse[i][j] + luma_sse_sum[i * BW + j];

        const double window_error = diff_sse * inv_num_ref_pixels;
        const int subblock_idx = y_blk_raster_offset + (j >= block_width / 2);
        const double combined_error =
            weight_factor * window_error + subblock_mses_scaled[subblock_idx];

        double scaled_error = combined_error * d_factor_decayed[subblock_idx];
        scaled_error = AOMMIN(scaled_error, 7);
        const float fweight =
            approx_exp((float)-scaled_error) * TF_WEIGHT_SCALE;
        const int weight = iroundpf(fweight);
        count[k] += weight;
        accumulator[k] += weight * pixel_value;
      }
    }
  }
}